

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void * prf_array_append_int(void *id,int elem)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *(uint *)((long)id + -4);
  uVar2 = uVar1 >> 4;
  if (*(uint *)((long)id + -8) <= uVar2) {
    id = prf_array_set_size(id,*(uint *)((long)id + -8) * 2);
    uVar1 = *(uint *)((long)id + -4);
    uVar2 = uVar1 >> 4;
  }
  *(uint *)((long)id + -4) = uVar1 + 0x10;
  *(int *)((long)id + (ulong)uVar2 * 4) = elem;
  return id;
}

Assistant:

void *
prf_array_append_int(void *id, int elem)
{
  int *ptr;
  array *arr; 
  
  arr = id_to_array(id);
  if (arr->numelem >= arr->size) {
    id = prf_array_set_size(id, arr->size<<1);
    arr = id_to_array(id);
  }
  ptr = (int*)id;
  ptr[arr->numelem++] = elem;
  return id;
}